

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O2

bool __thiscall PriorityBranchGroup::finished(PriorityBranchGroup *this)

{
  int iVar1;
  bool bVar2;
  uint i;
  ulong uVar3;
  
  bVar2 = true;
  if ((this->super_BranchGroup).fin.v == 0) {
    uVar3 = 0;
    do {
      if ((this->annotations).sz <= uVar3) {
        Tint::operator=(&(this->super_BranchGroup).fin,1);
        return true;
      }
      iVar1 = (**(this->annotations).data[uVar3]->_vptr_Branching)();
      uVar3 = uVar3 + 1;
    } while ((char)iVar1 != '\0');
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PriorityBranchGroup::finished() {
	if (fin != 0) {
		return true;
	}
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (!annotations[i]->finished()) {
			return false;
		}
	}
	fin = 1;
	return true;
}